

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O2

Barcodes *
ZXing::Pdf417::DoDecode
          (Barcodes *__return_storage_ptr__,BinaryBitmap *image,bool multiple,bool tryRotate,
          bool returnErrors)

{
  Nullable<ZXing::ResultPoint> *imageBottomRight;
  Nullable<ZXing::ResultPoint> *imageBottomLeft;
  bool bVar1;
  int minCodewordWidth;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint maxCodewordWidth;
  PointI PVar6;
  PointI PVar7;
  PointI PVar8;
  char cVar9;
  int iVar10;
  _List_node_base *p_Var11;
  uint uVar12;
  BarcodeFormat local_224;
  _List_node_base *local_220;
  Nullable<ZXing::ResultPoint> *local_218;
  Nullable<ZXing::ResultPoint> *local_210;
  Nullable<ZXing::ResultPoint> *local_208;
  Nullable<ZXing::ResultPoint> *local_200;
  Nullable<ZXing::ResultPoint> *local_1f8;
  Nullable<ZXing::ResultPoint> *local_1f0;
  Nullable<ZXing::ResultPoint> *local_1e8;
  BitMatrix *local_1e0;
  anon_class_16_2_7b74b981 point;
  Result detectorResult;
  DetectorResult local_198;
  undefined8 local_158;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_150;
  anon_class_48_1_ba1d7400 rotate;
  DecoderResult decoderResult;
  
  Detector::Detect(&detectorResult,image,multiple,tryRotate);
  if (detectorResult.points.
      super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&detectorResult.points) {
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    Detector::Result::Result(&rotate.res,&detectorResult);
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar1 = false;
    for (p_Var11 = detectorResult.points.
                   super__List_base<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
        p_Var11 != (_List_node_base *)&detectorResult.points; p_Var11 = p_Var11->_M_next) {
      local_218 = (Nullable<ZXing::ResultPoint> *)(p_Var11 + 1);
      local_1e0 = detectorResult.bits.
                  super___shared_ptr<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_208 = (Nullable<ZXing::ResultPoint> *)(p_Var11 + 7);
      local_210 = (Nullable<ZXing::ResultPoint> *)(p_Var11 + 10);
      local_200 = (Nullable<ZXing::ResultPoint> *)&p_Var11[0xb]._M_prev;
      local_1f0 = (Nullable<ZXing::ResultPoint> *)&p_Var11[8]._M_prev;
      minCodewordWidth = GetMinWidth(local_218,local_208);
      local_1e8 = (Nullable<ZXing::ResultPoint> *)(p_Var11 + 4);
      iVar2 = GetMinWidth((Nullable<ZXing::ResultPoint> *)(p_Var11 + 10),local_1e8);
      iVar10 = (iVar2 * 0x11) / 0x12;
      iVar2 = GetMinWidth((Nullable<ZXing::ResultPoint> *)&p_Var11[2]._M_prev,
                          (Nullable<ZXing::ResultPoint> *)&p_Var11[8]._M_prev);
      local_1f8 = (Nullable<ZXing::ResultPoint> *)&p_Var11[5]._M_prev;
      local_220 = p_Var11;
      iVar3 = GetMinWidth((Nullable<ZXing::ResultPoint> *)&p_Var11[0xb]._M_prev,local_1f8);
      iVar3 = (iVar3 * 0x11) / 0x12;
      if (iVar3 < iVar2) {
        iVar2 = iVar3;
      }
      if (iVar10 < minCodewordWidth) {
        minCodewordWidth = iVar10;
      }
      if (iVar2 < minCodewordWidth) {
        minCodewordWidth = iVar2;
      }
      uVar4 = GetMaxWidth(local_218,local_208);
      iVar2 = GetMaxWidth(local_210,local_1e8);
      imageBottomLeft = local_1f0;
      uVar12 = (uint)(iVar2 * 0x11) / 0x12;
      uVar5 = GetMaxWidth((Nullable<ZXing::ResultPoint> *)&p_Var11[2]._M_prev,local_1f0);
      imageBottomRight = local_200;
      iVar2 = GetMaxWidth(local_200,local_1f8);
      maxCodewordWidth = (uint)(iVar2 * 0x11) / 0x12;
      if (uVar12 < uVar4) {
        uVar12 = uVar4;
      }
      if (maxCodewordWidth < uVar5) {
        maxCodewordWidth = uVar5;
      }
      if (maxCodewordWidth < uVar12) {
        maxCodewordWidth = uVar12;
      }
      ScanningDecoder::Decode
                (&decoderResult,local_1e0,local_208,imageBottomLeft,local_210,imageBottomRight,
                 minCodewordWidth,maxCodewordWidth);
      p_Var11 = local_220;
      if (decoderResult._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          decoderResult._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (!returnErrors || decoderResult._error._type == None) goto LAB_00183d26;
LAB_00183c19:
        point.rotate = &rotate;
        point.points = (array<ZXing::Nullable<ZXing::ResultPoint>,_8UL> *)local_218;
        _Stack_150._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_150._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_158 = 0;
        _Stack_150._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        PVar6 = DoDecode::anon_class_16_2_7b74b981::operator()(&point,0);
        PVar7 = DoDecode::anon_class_16_2_7b74b981::operator()(&point,2);
        PVar8 = DoDecode::anon_class_16_2_7b74b981::operator()(&point,3);
        local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[3] =
             DoDecode::anon_class_16_2_7b74b981::operator()(&point,1);
        local_198._bits._width = 0;
        local_198._bits._height = 0;
        local_198._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_198._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198._bits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _Stack_150._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Stack_150._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        _Stack_150._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_224 = PDF417;
        local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[0] = PVar6;
        local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[1] = PVar7;
        local_198._position.super_array<ZXing::PointT<int>,_4UL>._M_elems[2] = PVar8;
        std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
        emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                  ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)__return_storage_ptr__,
                   &decoderResult,&local_198,&local_224);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&local_198._bits._bits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_150)
        ;
        bVar1 = (bool)(bVar1 | !multiple);
        cVar9 = multiple;
      }
      else {
        if (decoderResult._error._type == None || returnErrors) goto LAB_00183c19;
LAB_00183d26:
        cVar9 = '\x01';
      }
      DecoderResult::~DecoderResult(&decoderResult);
      if (cVar9 == '\0') {
        if (!bVar1) {
          std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                    (__return_storage_ptr__);
        }
        break;
      }
    }
    Detector::Result::~Result(&rotate.res);
  }
  Detector::Result::~Result(&detectorResult);
  return __return_storage_ptr__;
}

Assistant:

static Barcodes DoDecode(const BinaryBitmap& image, bool multiple, bool tryRotate, bool returnErrors)
{
	Detector::Result detectorResult = Detector::Detect(image, multiple, tryRotate);
	if (detectorResult.points.empty())
		return {};

	auto rotate = [res = detectorResult](PointI p) {
		switch(res.rotation) {
		case 90: return PointI(res.bits->height() - p.y - 1, p.x);
		case 180: return PointI(res.bits->width() - p.x - 1, res.bits->height() - p.y - 1);
		case 270: return PointI(p.y, res.bits->width() - p.x - 1);
		}
		return p;
	};

	Barcodes res;
	for (const auto& points : detectorResult.points) {
		DecoderResult decoderResult =
			ScanningDecoder::Decode(*detectorResult.bits, points[4], points[5], points[6], points[7],
									GetMinCodewordWidth(points), GetMaxCodewordWidth(points));
		if (decoderResult.isValid(returnErrors)) {
			auto point = [&](int i) { return rotate(PointI(points[i].value())); };
			res.emplace_back(std::move(decoderResult), DetectorResult{{}, {point(0), point(2), point(3), point(1)}},
							 BarcodeFormat::PDF417);
			if (!multiple)
				return res;
		}
	}
	return res;
}